

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalnull.c
# Opt level: O3

int ffsnul(fitsfile *fptr,int colnum,char *nulstring,int *status)

{
  uint uVar1;
  int iVar2;
  char *__dest;
  int hdutype;
  undefined8 uStack_28;
  
  uVar1 = *status;
  uStack_28 = (ulong)uVar1;
  if (0 < (int)uVar1) {
    return uVar1;
  }
  iVar2 = ffghdt(fptr,(int *)((long)&uStack_28 + 4),status);
  if (iVar2 < 1) {
    if (uStack_28._4_4_ != 1) {
      *status = 0xe2;
      return 0xe2;
    }
    __dest = fptr->Fptr->tableptr[(long)colnum + -1].strnull;
    *__dest = '\0';
    strncat(__dest,nulstring,0x13);
  }
  return *status;
}

Assistant:

int ffsnul(fitsfile *fptr,      /* I - FITS file pointer                  */
           int colnum,          /* I - column number to apply nulvalue to */
           char *nulstring,     /* I - null pixel value: value of TNULLn  */
           int *status)         /* IO - error status                      */
/*
  Define the string used to represent undefined pixels in the ASCII TABLE
  column. This routine overrides the null  value given by the TNULLn keyword
  if present.  Note that this routine does not write or modify the TNULLn
  keyword, but instead only modifies the value temporarily in the internal
  buffer. Thus, a subsequent call to the ffrdef routine will reset the null
  value back to the TNULLn keyword value (or not defined if the keyword is not
  present).
*/
{
    tcolumn *colptr;
    int hdutype;

    if (*status > 0)
        return(*status);

    if (ffghdt(fptr, &hdutype, status) > 0)  /* get HDU type */
        return(*status);

    if (hdutype != ASCII_TBL)
        return(*status = NOT_ATABLE);        /* not proper HDU type */
 
    colptr = (fptr->Fptr)->tableptr;   /* set pointer to the first column */
    colptr += (colnum - 1);    /* increment to the correct column */

    colptr->strnull[0] = '\0';
    strncat(colptr->strnull, nulstring, 19);  /* limit string to 19 chars */

    return(*status);
}